

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

wchar_t slot_by_type(player *p,wchar_t type,_Bool full)

{
  wchar_t local_24;
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t fallback;
  wchar_t i;
  _Bool full_local;
  wchar_t type_local;
  player *p_local;
  
  local_20 = (wchar_t)(p->body).count;
  for (local_1c = L'\0'; local_1c < (int)(uint)(p->body).count; local_1c = local_1c + L'\x01') {
    if (type == (uint)(p->body).slots[local_1c].type) {
      if (full) {
        if ((p->body).slots[local_1c].obj != (object *)0x0) break;
      }
      else if ((p->body).slots[local_1c].obj == (object *)0x0) break;
      if (local_20 == (uint)(p->body).count) {
        local_20 = local_1c;
      }
    }
  }
  if (local_1c == (uint)(p->body).count) {
    local_24 = local_20;
  }
  else {
    local_24 = local_1c;
  }
  return local_24;
}

Assistant:

static int slot_by_type(struct player *p, int type, bool full)
{
	int i, fallback = p->body.count;

	/* Look for a correct slot type */
	for (i = 0; i < p->body.count; i++) {
		if (type == p->body.slots[i].type) {
			if (full) {
				/* Found a full slot */
				if (p->body.slots[i].obj != NULL) break;
			} else {
				/* Found an empty slot */
				if (p->body.slots[i].obj == NULL) break;
			}
			/* Not right for full/empty, but still the right type */
			if (fallback == p->body.count)
				fallback = i;
		}
	}

	/* Index for the best slot we found, or p->body.count if none found  */
	return (i != p->body.count) ? i : fallback;
}